

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

bool read_seed_file(char *pSeed_filename,lzham_uint32 *num_seed_bytes,void **pSeed_bytes,
                   uint dict_size_log2)

{
  FILE *__stream;
  long lVar1;
  size_t sVar2;
  byte in_CL;
  long *in_RDX;
  int *in_RSI;
  char *in_RDI;
  lzham_uint32 seed_size;
  uint64 seed_file_size;
  FILE *pSeed_file;
  ulong local_48;
  
  *in_RSI = 0;
  *in_RDX = 0;
  if (in_RDI != (char *)0x0) {
    __stream = fopen64(in_RDI,"rb");
    if (__stream == (FILE *)0x0) {
      print_error("Unable to open file: %s\n",in_RDI);
      return false;
    }
    fseeko64(__stream,0,2);
    local_48 = ftello64(__stream);
    fseeko64(__stream,0,0);
    if ((ulong)(1L << (in_CL & 0x3f)) <= local_48) {
      local_48 = 1L << (in_CL & 0x3f);
    }
    if ((int)local_48 != 0) {
      lVar1 = memalign(0x10,local_48 & 0xffffffff);
      *in_RDX = lVar1;
      if (*in_RDX != 0) {
        *in_RSI = (int)local_48;
        sVar2 = fread((void *)*in_RDX,1,local_48 & 0xffffffff,__stream);
        if (sVar2 != (local_48 & 0xffffffff)) {
          print_error("Failed reading file!\n");
          *in_RSI = 0;
          free((void *)*in_RDX);
          *in_RDX = 0;
          fclose(__stream);
          return false;
        }
      }
    }
    fclose(__stream);
    printf("Read File \"%s\", Size: %u bytes\n",in_RDI,local_48 & 0xffffffff);
  }
  return true;
}

Assistant:

static bool read_seed_file(const char *pSeed_filename, lzham_uint32 &num_seed_bytes, const void *&pSeed_bytes, uint dict_size_log2)
{
   num_seed_bytes = 0;
   pSeed_bytes = NULL;

   if (pSeed_filename)
   {
      FILE *pSeed_file = fopen(pSeed_filename, "rb");
      if (!pSeed_file)
      {
         print_error("Unable to open file: %s\n", pSeed_filename);
         return false;
      }

      _fseeki64(pSeed_file, 0, SEEK_END);
      uint64 seed_file_size = _ftelli64(pSeed_file);
      _fseeki64(pSeed_file, 0, SEEK_SET);

      lzham_uint32 seed_size = (lzham_uint32)my_min(seed_file_size, 1ULL << dict_size_log2);
      if (seed_size)
      {
         pSeed_bytes = _aligned_malloc(seed_size, 16);
         if (pSeed_bytes)
         {
            num_seed_bytes = (lzham_uint32)seed_size;

            if (fread((void*)pSeed_bytes, 1, seed_size, pSeed_file) != seed_size)
            {
               print_error("Failed reading file!\n");

               num_seed_bytes = 0;

               _aligned_free((void*)pSeed_bytes);
               pSeed_bytes = NULL;
               fclose(pSeed_file);
               return false;
            }
         }
      }

      fclose(pSeed_file);

      printf("Read File \"%s\", Size: %u bytes\n", pSeed_filename, seed_size);
   }

   return true;
}